

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  size_t sVar2;
  ostream *poVar3;
  pointer pSVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar4 = pSVar4 + 1, pSVar4 != pSVar1) {
      printHeaderString(this,&pSVar4->name,2);
    }
    Colour::use(None);
  }
  pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.file = pSVar4[-1].lineInfo.file;
  local_28.line = pSVar4[-1].lineInfo.line;
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000b80a40 = 0x2d2d2d2d2d2d2d;
    uRam0000000000b80a47._0_1_ = '-';
    uRam0000000000b80a47._1_1_ = '-';
    uRam0000000000b80a47._2_1_ = '-';
    uRam0000000000b80a47._3_1_ = '-';
    uRam0000000000b80a47._4_1_ = '-';
    uRam0000000000b80a47._5_1_ = '-';
    uRam0000000000b80a47._6_1_ = '-';
    uRam0000000000b80a47._7_1_ = '-';
    DAT_00b80a30 = '-';
    DAT_00b80a30_1._0_1_ = '-';
    DAT_00b80a30_1._1_1_ = '-';
    DAT_00b80a30_1._2_1_ = '-';
    DAT_00b80a30_1._3_1_ = '-';
    DAT_00b80a30_1._4_1_ = '-';
    DAT_00b80a30_1._5_1_ = '-';
    DAT_00b80a30_1._6_1_ = '-';
    uRam0000000000b80a38 = 0x2d2d2d2d2d2d2d;
    DAT_00b80a3f = 0x2d;
    DAT_00b80a20 = '-';
    DAT_00b80a20_1._0_1_ = '-';
    DAT_00b80a20_1._1_1_ = '-';
    DAT_00b80a20_1._2_1_ = '-';
    DAT_00b80a20_1._3_1_ = '-';
    DAT_00b80a20_1._4_1_ = '-';
    DAT_00b80a20_1._5_1_ = '-';
    DAT_00b80a20_1._6_1_ = '-';
    uRam0000000000b80a28._0_1_ = '-';
    uRam0000000000b80a28._1_1_ = '-';
    uRam0000000000b80a28._2_1_ = '-';
    uRam0000000000b80a28._3_1_ = '-';
    uRam0000000000b80a28._4_1_ = '-';
    uRam0000000000b80a28._5_1_ = '-';
    uRam0000000000b80a28._6_1_ = '-';
    uRam0000000000b80a28._7_1_ = '-';
    DAT_00b80a10 = '-';
    DAT_00b80a10_1._0_1_ = '-';
    DAT_00b80a10_1._1_1_ = '-';
    DAT_00b80a10_1._2_1_ = '-';
    DAT_00b80a10_1._3_1_ = '-';
    DAT_00b80a10_1._4_1_ = '-';
    DAT_00b80a10_1._5_1_ = '-';
    DAT_00b80a10_1._6_1_ = '-';
    uRam0000000000b80a18._0_1_ = '-';
    uRam0000000000b80a18._1_1_ = '-';
    uRam0000000000b80a18._2_1_ = '-';
    uRam0000000000b80a18._3_1_ = '-';
    uRam0000000000b80a18._4_1_ = '-';
    uRam0000000000b80a18._5_1_ = '-';
    uRam0000000000b80a18._6_1_ = '-';
    uRam0000000000b80a18._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000b80a08._0_1_ = '-';
    uRam0000000000b80a08._1_1_ = '-';
    uRam0000000000b80a08._2_1_ = '-';
    uRam0000000000b80a08._3_1_ = '-';
    uRam0000000000b80a08._4_1_ = '-';
    uRam0000000000b80a08._5_1_ = '-';
    uRam0000000000b80a08._6_1_ = '-';
    uRam0000000000b80a08._7_1_ = '-';
    DAT_00b80a4f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000b80ae0 = 0x2e2e2e2e2e2e2e;
    uRam0000000000b80ae7._0_1_ = '.';
    uRam0000000000b80ae7._1_1_ = '.';
    uRam0000000000b80ae7._2_1_ = '.';
    uRam0000000000b80ae7._3_1_ = '.';
    uRam0000000000b80ae7._4_1_ = '.';
    uRam0000000000b80ae7._5_1_ = '.';
    uRam0000000000b80ae7._6_1_ = '.';
    uRam0000000000b80ae7._7_1_ = '.';
    DAT_00b80ad0 = '.';
    DAT_00b80ad0_1._0_1_ = '.';
    DAT_00b80ad0_1._1_1_ = '.';
    DAT_00b80ad0_1._2_1_ = '.';
    DAT_00b80ad0_1._3_1_ = '.';
    DAT_00b80ad0_1._4_1_ = '.';
    DAT_00b80ad0_1._5_1_ = '.';
    DAT_00b80ad0_1._6_1_ = '.';
    uRam0000000000b80ad8 = 0x2e2e2e2e2e2e2e;
    DAT_00b80adf = 0x2e;
    DAT_00b80ac0 = '.';
    DAT_00b80ac0_1._0_1_ = '.';
    DAT_00b80ac0_1._1_1_ = '.';
    DAT_00b80ac0_1._2_1_ = '.';
    DAT_00b80ac0_1._3_1_ = '.';
    DAT_00b80ac0_1._4_1_ = '.';
    DAT_00b80ac0_1._5_1_ = '.';
    DAT_00b80ac0_1._6_1_ = '.';
    uRam0000000000b80ac8._0_1_ = '.';
    uRam0000000000b80ac8._1_1_ = '.';
    uRam0000000000b80ac8._2_1_ = '.';
    uRam0000000000b80ac8._3_1_ = '.';
    uRam0000000000b80ac8._4_1_ = '.';
    uRam0000000000b80ac8._5_1_ = '.';
    uRam0000000000b80ac8._6_1_ = '.';
    uRam0000000000b80ac8._7_1_ = '.';
    DAT_00b80ab0 = '.';
    DAT_00b80ab0_1._0_1_ = '.';
    DAT_00b80ab0_1._1_1_ = '.';
    DAT_00b80ab0_1._2_1_ = '.';
    DAT_00b80ab0_1._3_1_ = '.';
    DAT_00b80ab0_1._4_1_ = '.';
    DAT_00b80ab0_1._5_1_ = '.';
    DAT_00b80ab0_1._6_1_ = '.';
    uRam0000000000b80ab8._0_1_ = '.';
    uRam0000000000b80ab8._1_1_ = '.';
    uRam0000000000b80ab8._2_1_ = '.';
    uRam0000000000b80ab8._3_1_ = '.';
    uRam0000000000b80ab8._4_1_ = '.';
    uRam0000000000b80ab8._5_1_ = '.';
    uRam0000000000b80ab8._6_1_ = '.';
    uRam0000000000b80ab8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000b80aa8._0_1_ = '.';
    uRam0000000000b80aa8._1_1_ = '.';
    uRam0000000000b80aa8._2_1_ = '.';
    uRam0000000000b80aa8._3_1_ = '.';
    uRam0000000000b80aa8._4_1_ = '.';
    uRam0000000000b80aa8._5_1_ = '.';
    uRam0000000000b80aa8._6_1_ = '.';
    uRam0000000000b80aa8._7_1_ = '.';
    DAT_00b80aef = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString((*it).name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << '\n';
}